

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::DeformableConv2D_x86_avx::create_pipeline(DeformableConv2D_x86_avx *this,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  int *piVar4;
  void *pvVar5;
  long *plVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Mat *pMVar9;
  Layer *pLVar10;
  int _elempack;
  ulong uVar11;
  undefined4 *puVar12;
  _func_int ***ppp_Var13;
  _func_int ***ppp_Var14;
  long lVar15;
  undefined4 *puVar16;
  ulong uVar17;
  Allocator *pAVar18;
  _func_int ***ppp_Var19;
  long lVar20;
  int iVar21;
  int iVar22;
  int k;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  _func_int ***ppp_Var26;
  undefined1 auVar27 [16];
  ParamDict pd_5;
  ParamDict pd;
  undefined1 auStack_198 [8];
  undefined8 uStack_190;
  uint local_188;
  uint local_184;
  Option *local_180;
  Allocator *local_178;
  ParamDict local_170;
  ulong local_160;
  Mat local_158;
  void *local_110;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  long *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined8 local_d0;
  ulong local_c0;
  DeformableConv2D_x86_avx *local_b8;
  undefined4 *local_b0;
  ModelBinFromMatArray local_a8;
  Mat local_98;
  undefined4 *local_50;
  Mat *local_48;
  long local_40;
  long local_38;
  
  p_Var2 = this->_vptr_DeformableConv2D_x86_avx[-3];
  local_180 = opt;
  switch(*(undefined4 *)(&this->field_0x104 + (long)p_Var2)) {
  case 1:
    uStack_190 = 0x583e88;
    pLVar10 = create_layer(0x1a);
    uStack_190 = 0x583e98;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x583ea4;
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_158);
    break;
  case 2:
    uStack_190 = 0x583f81;
    pLVar10 = create_layer(0x1a);
    uStack_190 = 0x583f91;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x583fa7;
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var2));
    uStack_190 = 0x583fb5;
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_158);
    goto LAB_00584011;
  case 3:
    uStack_190 = 0x583ee8;
    pLVar10 = create_layer(0x36);
    uStack_190 = 0x583ef8;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x583f0e;
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var2));
    uStack_190 = 0x583f2a;
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)(*(long *)(&this->field_0x108 + (long)p_Var2) + 4));
    uStack_190 = 0x583f38;
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_158);
    goto LAB_00584011;
  case 4:
    uStack_190 = 0x583f47;
    pLVar10 = create_layer(0x1e);
    uStack_190 = 0x583f57;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x583f63;
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_158);
    break;
  case 5:
    uStack_190 = 0x583eb8;
    pLVar10 = create_layer(0x47);
    uStack_190 = 0x583ec8;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x583ed4;
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_158);
    break;
  case 6:
    uStack_190 = 0x583fc1;
    pLVar10 = create_layer(0x43);
    uStack_190 = 0x583fd1;
    ParamDict::ParamDict((ParamDict *)&local_158);
    uStack_190 = 0x583fe7;
    ParamDict::set((ParamDict *)&local_158,0,**(float **)(&this->field_0x108 + (long)p_Var2));
    uStack_190 = 0x584003;
    ParamDict::set((ParamDict *)&local_158,1,
                   *(float *)(*(long *)(&this->field_0x108 + (long)p_Var2) + 4));
    uStack_190 = 0x584011;
    (*pLVar10->_vptr_Layer[2])(pLVar10,&local_158);
LAB_00584011:
    uStack_190 = 0x58401b;
    ParamDict::~ParamDict((ParamDict *)&local_158);
    opt = local_180;
    goto LAB_00584025;
  default:
    pLVar10 = (Layer *)0x0;
    goto LAB_00584025;
  }
  opt = local_180;
  uStack_190 = 0x583f72;
  ParamDict::~ParamDict((ParamDict *)&local_158);
LAB_00584025:
  if (pLVar10 != (Layer *)0x0) {
    uStack_190 = 0x584036;
    (*pLVar10->_vptr_Layer[4])(pLVar10,opt);
  }
  this->activation = pLVar10;
  p_Var2 = this->_vptr_DeformableConv2D_x86_avx[-3];
  iVar22 = *(int *)(&this->field_0xd4 + (long)p_Var2);
  lVar23 = (long)iVar22;
  local_178 = (Allocator *)(long)*(int *)(&this->field_0xd8 + (long)p_Var2);
  local_184 = *(int *)(&this->field_0xd8 + (long)p_Var2) * iVar22;
  uVar1 = *(uint *)(&this->field_0xd0 + (long)p_Var2);
  local_c0 = (ulong)uVar1;
  uVar11 = (long)*(int *)(&this->field_0x100 + (long)p_Var2) / (long)(int)local_184;
  uVar11 = (ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff;
  uVar17 = (long)uVar11 / (long)(int)uVar1;
  local_188 = (uint)uVar17;
  iVar21 = 1;
  uVar25 = 1;
  uVar11 = (long)uVar11 % (long)(int)uVar1 & 0xffffffff;
  if (opt->use_packing_layout == true) {
    uVar25 = (uint)((uVar17 & 3) == 0) * 3 + 1;
    if ((uVar17 & 7) == 0) {
      uVar25 = 8;
    }
    iVar21 = (uint)((uVar1 & 3) == 0) * 3 + 1;
    uVar11 = local_c0;
    if ((uVar1 & 7) == 0) {
      iVar21 = 8;
    }
  }
  local_b8 = this;
  if (opt->use_sgemm_convolution == true) {
    uStack_190 = 0x5840e6;
    pLVar10 = create_layer(0x4a);
    this->gemm = pLVar10;
    uStack_190 = 0x5840f7;
    ParamDict::ParamDict(&local_170);
    uStack_190 = 0x584106;
    ParamDict::set(&local_170,2,0);
    uStack_190 = 0x584117;
    ParamDict::set(&local_170,3,0);
    uStack_190 = 0x58412b;
    ParamDict::set(&local_170,4,1);
    uStack_190 = 0x58413c;
    ParamDict::set(&local_170,5,0);
    uStack_190 = 0x584150;
    ParamDict::set(&local_170,6,1);
    uStack_190 = 0x58416e;
    ParamDict::set(&local_170,7,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]));
    uStack_190 = 0x58417f;
    ParamDict::set(&local_170,8,0);
    iVar22 = local_188 * local_184;
    uStack_190 = 0x58419b;
    ParamDict::set(&local_170,9,iVar22);
    uStack_190 = 0x5841c1;
    ParamDict::set(&local_170,10,
                   -(uint)(*(int *)(&this->field_0xfc +
                                   (long)this->_vptr_DeformableConv2D_x86_avx[-3]) == 0) | 1);
    uStack_190 = 0x5841d5;
    ParamDict::set(&local_170,0xb,1);
    uStack_190 = 0x5841e4;
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_170);
    local_98.cstep = 0;
    local_98.data = (Allocator *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elempack = 0;
    local_98._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
    uStack_190 = 0x584234;
    local_98.elemsize._4_4_ = (int)local_98.refcount;
    local_98.allocator = (Allocator *)local_98.data;
    local_98.dims = (int)local_98.refcount;
    local_98.w = local_98.refcount._4_4_;
    local_98.c = local_98.elempack;
    Mat::reshape(&local_158,
                 (Mat *)(&this->field_0x150 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]),
                 local_184,local_188,
                 (int)((Mat *)(&this->field_0x150 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]))
                      [-2].elemsize,(Allocator *)0x0);
    uStack_190 = 0x58425b;
    Mat::create(&local_98,iVar22,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]),4,
                (Allocator *)0x0);
    opt = local_180;
    pp_Var3 = this->_vptr_DeformableConv2D_x86_avx;
    if (0 < *(int *)(&this->field_0xd0 + (long)pp_Var3[-3])) {
      local_178 = (Allocator *)local_98.data;
      local_160 = (long)local_98.w * CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
      ;
      uVar11 = (ulong)uVar25;
      lVar23 = 0;
      do {
        if ((int)uVar25 <= (int)local_188) {
          lVar20 = (long)local_158.w *
                   CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
          ppp_Var13 = (_func_int ***)
                      ((long)(_func_int ***)local_158.data +
                      CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize) *
                      local_158.cstep * lVar23);
          ppp_Var19 = (_func_int ***)((long)(_func_int ***)local_98.data + local_160 * lVar23);
          lVar15 = 0;
          do {
            if (0 < (int)local_184) {
              uVar24 = 0;
              uVar17 = uVar11;
              ppp_Var26 = ppp_Var13;
              ppp_Var14 = ppp_Var13;
              do {
                do {
                  *(undefined4 *)ppp_Var19 = *(undefined4 *)ppp_Var26;
                  ppp_Var19 = (_func_int ***)((long)ppp_Var19 + 4);
                  uVar17 = uVar17 - 1;
                  ppp_Var26 = (_func_int ***)((long)ppp_Var26 + lVar20);
                } while (uVar17 != 0);
                uVar24 = uVar24 + 1;
                ppp_Var26 = (_func_int ***)((long)ppp_Var14 + 4);
                uVar17 = uVar11;
                ppp_Var14 = ppp_Var26;
              } while (uVar24 != local_184);
            }
            lVar15 = lVar15 + uVar11;
            ppp_Var13 = (_func_int ***)((long)ppp_Var13 + lVar20 * uVar11);
          } while (lVar15 < (long)((long)(int)local_188 - (ulong)(uVar25 - 1)));
        }
        lVar23 = lVar23 + 1;
        this = local_b8;
      } while (lVar23 < *(int *)(&local_b8->field_0xd0 + (long)pp_Var3[-3]));
    }
    piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_158.data != (Allocator *)0x0) {
            uStack_190 = 0x584600;
            free(local_158.data);
          }
        }
        else {
          uStack_190 = 0x584379;
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (*(int *)(&this->field_0xfc + (long)this->_vptr_DeformableConv2D_x86_avx[-3]) == 0) {
      piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      local_158.data = local_98.data;
      local_158.refcount._0_4_ = (int)local_98.refcount;
      local_158.refcount._4_4_ = local_98.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_158.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_158.elempack = local_98.elempack;
      local_158.allocator = local_98.allocator;
      local_158.dims = local_98.dims;
      local_158.w = local_98.w;
      local_158.h = local_98.h;
      local_158.d = local_98.d;
      local_158.c = local_98.c;
      local_158.cstep = local_98.cstep;
      pLVar10 = this->gemm;
      uStack_190 = 0x584a1d;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_158);
      uStack_190 = 0x584a2e;
      (*pLVar10->_vptr_Layer[3])(pLVar10,&local_a8);
      uStack_190 = 0x584a3b;
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_158.data != (Allocator *)0x0) {
              uStack_190 = 0x584a7d;
              free(local_158.data);
            }
          }
          else {
            uStack_190 = 0x584a67;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      lVar23 = 0x40;
      auVar27._0_12_ = ZEXT812(0);
      auVar27._12_4_ = 0;
      do {
        *(undefined8 *)((long)&local_158.data + lVar23) = 0;
        *(undefined1 (*) [16])(auStack_198 + lVar23) = auVar27;
        *(undefined1 (*) [16])((long)&uStack_190 + lVar23 + 4) = auVar27;
        *(undefined1 (*) [16])((long)&local_178 + lVar23) = auVar27;
        *(undefined1 (*) [16])((long)&local_170._vptr_ParamDict + lVar23 + 4) = auVar27;
        lVar23 = lVar23 + 0x48;
      } while (lVar23 != 0xd0);
      piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_158.data != (Allocator *)0x0) {
              uStack_190 = 0x5846fd;
              free(local_158.data);
            }
          }
          else {
            uStack_190 = 0x584684;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_158.data = local_98.data;
      local_158.refcount._0_4_ = (int)local_98.refcount;
      local_158.refcount._4_4_ = local_98.refcount._4_4_;
      local_158.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_158.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_158.elempack = local_98.elempack;
      local_158.allocator = local_98.allocator;
      local_158.dims = local_98.dims;
      local_158.w = local_98.w;
      local_158.h = local_98.h;
      local_158.d = local_98.d;
      local_158.c = local_98.c;
      local_158.cstep = local_98.cstep;
      p_Var2 = this->_vptr_DeformableConv2D_x86_avx[-3];
      if (&local_110 != (void **)(&this->field_0x198 + (long)p_Var2)) {
        piVar4 = *(int **)(&this->field_0x1a0 + (long)p_Var2);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(uStack_104,uStack_108);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_f0 == (long *)0x0) {
              if (local_110 != (void *)0x0) {
                uStack_190 = 0x5847ca;
                free(local_110);
              }
            }
            else {
              uStack_190 = 0x5847bb;
              (**(code **)(*local_f0 + 0x18))();
            }
          }
        }
        local_110 = *(void **)(&this->field_0x198 + (long)p_Var2);
        uStack_108 = (undefined4)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var2);
        uStack_104 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var2) >> 0x20)
        ;
        uStack_100 = (undefined4)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var2);
        uStack_fc = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var2) >> 0x20);
        uStack_f8 = *(undefined4 *)(&this->field_0x1b0 + (long)p_Var2);
        local_f0 = *(long **)(&this->field_0x1b8 + (long)p_Var2);
        local_e8 = *(undefined8 *)(&this->field_0x1c0 + (long)p_Var2);
        uStack_e0 = *(undefined8 *)(&this->field_0x1c8 + (long)p_Var2);
        local_d8 = *(undefined4 *)(&this->field_0x1d0 + (long)p_Var2);
        local_d0 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var2);
      }
      pLVar10 = this->gemm;
      uStack_190 = 0x584877;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_a8,&local_158);
      uStack_190 = 0x584888;
      (*pLVar10->_vptr_Layer[3])(pLVar10,&local_a8);
      uStack_190 = 0x584895;
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_a8);
      lVar23 = 0x48;
      do {
        piVar4 = *(int **)((long)&local_158.refcount + lVar23);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pvVar5 = *(void **)((long)&local_158.data + lVar23);
            plVar6 = *(long **)((long)&local_158.allocator + lVar23);
            if (plVar6 == (long *)0x0) {
              if (pvVar5 != (void *)0x0) {
                uStack_190 = 0x5848d5;
                free(pvVar5);
              }
            }
            else {
              uStack_190 = 0x5848c2;
              (**(code **)(*plVar6 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_158.cstep + lVar23) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar23 + 4) = 0;
        *(undefined8 *)((long)&local_158.elemsize + lVar23 + 4) = 0;
        *(undefined8 *)((long)&local_158.data + lVar23) = 0;
        *(undefined8 *)((long)&local_158.refcount + lVar23) = 0;
        *(undefined8 *)((long)&local_158.dims + lVar23) = 0;
        *(undefined8 *)((long)&local_158.h + lVar23) = 0;
        *(undefined4 *)((long)&local_158.c + lVar23) = 0;
        lVar23 = lVar23 + -0x48;
        opt = local_180;
      } while (lVar23 != -0x48);
    }
    uStack_190 = 0x58491a;
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar4 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_98.data != (Allocator *)0x0) {
            uStack_190 = 0x584956;
            free(local_98.data);
          }
        }
        else {
          uStack_190 = 0x584947;
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.cstep = 0;
    local_98.data = (void *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    uStack_190 = 0x584995;
    ParamDict::~ParamDict(&local_170);
  }
  else if ((iVar21 == 1) && (uVar25 == 1)) {
    if (p_Var2 != (_func_int *)0xfffffffffffffec0) {
      piVar4 = *(int **)(&this->field_0x158 + (long)p_Var2);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (this->weight_data_tm).refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = (this->weight_data_tm).data;
          pAVar18 = (this->weight_data_tm).allocator;
          if (pAVar18 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              uStack_190 = 0x584b42;
              free(pvVar5);
            }
          }
          else {
            uStack_190 = 0x5843d9;
            (*pAVar18->_vptr_Allocator[3])(pAVar18,pvVar5,uVar11);
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
      (this->weight_data_tm).data = (void *)0x0;
      (this->weight_data_tm).refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      piVar4 = *(int **)((long)(&this->field_0x150 + (long)p_Var2) + 8);
      (this->weight_data_tm).data = *(void **)(&this->field_0x150 + (long)p_Var2);
      (this->weight_data_tm).refcount = piVar4;
      (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x160 + (long)p_Var2);
      (this->weight_data_tm).elempack = *(int *)(&this->field_0x168 + (long)p_Var2);
      (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x170 + (long)p_Var2);
      uVar7 = *(undefined8 *)(&this->field_0x178 + (long)p_Var2);
      uVar8 = *(undefined8 *)((long)(&this->field_0x178 + (long)p_Var2) + 8);
      (this->weight_data_tm).dims = (int)uVar7;
      (this->weight_data_tm).w = (int)((ulong)uVar7 >> 0x20);
      (this->weight_data_tm).h = (int)uVar8;
      (this->weight_data_tm).d = (int)((ulong)uVar8 >> 0x20);
      (this->weight_data_tm).c = *(int *)(&this->field_0x188 + (long)p_Var2);
      (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x190 + (long)p_Var2);
      opt = local_180;
    }
  }
  else {
    local_48 = &this->weight_data_tm;
    local_50 = *(undefined4 **)(&this->field_0x150 + (long)p_Var2);
    _elempack = uVar25 * iVar21;
    uStack_190 = 0x584428;
    Mat::create(local_48,(int)(local_188 * local_184 * uVar1) / _elempack,
                (ulong)(uint)(_elempack * 4),_elempack,(Allocator *)0x0);
    pMVar9 = local_48;
    if (0 < (int)uVar1) {
      pvVar5 = (local_b8->weight_data_tm).data;
      lVar15 = (long)(int)local_188 * (long)local_178 * lVar23;
      local_40 = lVar15 * 4;
      local_38 = lVar23 * 4;
      local_160 = 0;
      do {
        if (0 < (int)local_178) {
          local_b0 = local_50;
          pAVar18 = (Allocator *)0x0;
          do {
            if (0 < iVar22) {
              lVar20 = 0;
              puVar12 = local_b0;
              do {
                if (0 < (int)local_188) {
                  uVar11 = (ulong)(uint)((int)local_160 >> 0x1f) << 0x20 | local_160 & 0xffffffff;
                  uVar17 = 0;
                  puVar16 = puVar12;
                  do {
                    uVar24 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
                    *(undefined4 *)
                     ((long)pvVar5 +
                     (long)(int)((((int)((long)uVar24 / (long)(int)uVar25) +
                                  ((int)lVar20 +
                                  ((int)((long)uVar11 / (long)iVar21) * (int)local_178 +
                                  (int)pAVar18) * iVar22) * ((int)local_188 / (int)uVar25)) * uVar25
                                 + (int)((long)uVar24 % (long)(int)uVar25)) * iVar21 +
                                (int)((long)uVar11 % (long)iVar21)) * 4) = *puVar16;
                    uVar17 = uVar17 + 1;
                    puVar16 = puVar16 + (long)local_178 * lVar23;
                  } while (local_188 != uVar17);
                }
                lVar20 = lVar20 + 1;
                puVar12 = puVar12 + 1;
              } while (lVar20 != lVar23);
            }
            pAVar18 = (Allocator *)((long)&pAVar18->_vptr_Allocator + 1);
            local_b0 = local_b0 + lVar23;
          } while (pAVar18 != local_178);
        }
        local_160 = local_160 + 1;
        local_50 = local_50 + lVar15;
      } while (local_160 != local_c0);
    }
    uStack_190 = 0x58459e;
    Mat::reshape(&local_158,local_48,(int)local_188 / (int)uVar25,local_184,
                 (int)((long)((ulong)(uint)((int)local_c0 >> 0x1f) << 0x20 | local_c0 & 0xffffffff)
                      / (long)iVar21),(Allocator *)0x0);
    this = local_b8;
    opt = local_180;
    if (&local_158 != pMVar9) {
      piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (local_b8->weight_data_tm).refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          pvVar5 = (local_b8->weight_data_tm).data;
          pAVar18 = (local_b8->weight_data_tm).allocator;
          if (pAVar18 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              uStack_190 = 0x584a8f;
              free(pvVar5);
            }
          }
          else {
            uStack_190 = 0x5845ee;
            (*pAVar18->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_tm).cstep = 0;
      *(undefined8 *)((long)&pMVar9->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar9->elemsize + 4) = 0;
      pMVar9->data = (void *)0x0;
      pMVar9->refcount = (int *)0x0;
      (this->weight_data_tm).dims = 0;
      (this->weight_data_tm).w = 0;
      (this->weight_data_tm).h = 0;
      (this->weight_data_tm).d = 0;
      (this->weight_data_tm).c = 0;
      (this->weight_data_tm).data = local_158.data;
      (this->weight_data_tm).refcount =
           (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
      (this->weight_data_tm).elemsize =
           CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
      (this->weight_data_tm).elempack = local_158.elempack;
      (this->weight_data_tm).allocator = local_158.allocator;
      (this->weight_data_tm).dims = local_158.dims;
      (this->weight_data_tm).w = local_158.w;
      (this->weight_data_tm).h = local_158.h;
      (this->weight_data_tm).d = local_158.d;
      (this->weight_data_tm).c = local_158.c;
      (this->weight_data_tm).cstep = local_158.cstep;
    }
    piVar4 = (int *)CONCAT44(local_158.refcount._4_4_,(int)local_158.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_158.data != (Allocator *)0x0) {
            uStack_190 = 0x584b33;
            free(local_158.data);
          }
        }
        else {
          uStack_190 = 0x584b1d;
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (opt->lightmode == true) {
    p_Var2 = this->_vptr_DeformableConv2D_x86_avx[-3];
    piVar4 = *(int **)(&this->field_0x158 + (long)p_Var2);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (*(long **)(&this->field_0x170 + (long)p_Var2) == (long *)0x0) {
          if (*(void **)(&this->field_0x150 + (long)p_Var2) != (void *)0x0) {
            uStack_190 = 0x584bfd;
            free(*(void **)(&this->field_0x150 + (long)p_Var2));
          }
        }
        else {
          uStack_190 = 0x584bee;
          (**(code **)(**(long **)(&this->field_0x170 + (long)p_Var2) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x190 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x15c + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x164 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x150 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var2) = 0;
    *(undefined8 *)(&this->field_0x180 + (long)p_Var2) = 0;
    *(undefined4 *)(&this->field_0x188 + (long)p_Var2) = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86_avx::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else if (elempack == 1 && out_elempack == 1)
    {
        weight_data_tm = weight_data;
    }
    else
    {
        deformableconv2d_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}